

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgemv_toe(int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
                 double *y,int incy,double *z,int incz)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf3,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf4,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf5,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (z == (double *)0x0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf6,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == z) {
    __assert_fail("x != z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf7,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf8,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf9,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xfa,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (0 < incy) {
    if (0 < incz) {
      if (0 < n) {
        uVar4 = 0;
        do {
          dVar5 = y[uVar4 * (uint)incy] * beta;
          pdVar1 = x;
          uVar2 = (ulong)(uint)m;
          pdVar3 = a;
          if (0 < m) {
            do {
              dVar5 = dVar5 + *pdVar3 * alpha * *pdVar1;
              pdVar1 = pdVar1 + (uint)incx;
              pdVar3 = pdVar3 + (uint)lda;
              uVar2 = uVar2 - 1;
            } while (uVar2 != 0);
          }
          z[uVar4 * (uint)incz] = dVar5;
          uVar4 = uVar4 + 1;
          a = a + 1;
        } while (uVar4 != (uint)n);
      }
      return;
    }
    __assert_fail("incz > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xfc,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  __assert_fail("incy > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0xfb,
                "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemv_toe(
        int m, int n,
        double alpha,
        const double *a, int lda,
        const double *x, int incx,
        double beta,
        const double *y, int incy,
        double *z, int incz)
{
    assert(a);
    assert(x);
    assert(y);
    assert(z);
    assert(x != z);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);
    assert(incz > 0);

    for (int i = 0; i < n; i++) {
        double zi = beta * y[i * incy];
        for (int j = 0; j < m; j++) {
            zi += alpha * a[j * lda + i] * x[j * incx];
        }
        z[i * incz] = zi;
    }
}